

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retire_cid.c
# Opt level: O2

void quicly_retire_cid_push(quicly_retire_cid_set_t *set,uint64_t sequence)

{
  uint64_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = set->_num_pending;
  if (sVar2 != 8) {
    sVar3 = 0;
    do {
      if (sVar2 == sVar3) {
        set->sequences[sVar2] = sequence;
        set->_num_pending = set->_num_pending + 1;
        return;
      }
      puVar1 = set->sequences + sVar3;
      sVar3 = sVar3 + 1;
    } while (*puVar1 != sequence);
  }
  return;
}

Assistant:

void quicly_retire_cid_push(quicly_retire_cid_set_t *set, uint64_t sequence)
{
    if (set->_num_pending == PTLS_ELEMENTSOF(set->sequences)) {
        /* in case we don't find an empty slot, we'll just drop this sequence (never send RETIRE_CONNECTION_ID frame) */
        return;
    }

    for (size_t i = 0; i < set->_num_pending; i++) {
        if (set->sequences[i] == sequence) {
            /* already scheduled */
            return;
        }
    }

    set->sequences[set->_num_pending] = sequence;
    set->_num_pending++;
}